

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_cb_dbg.c
# Opt level: O0

int tool_debug_cb(CURL *handle,curl_infotype type,char *data,size_t size,void *userdata)

{
  GlobalConfig *config_00;
  int iVar1;
  char *pcVar2;
  FILE *pFVar3;
  timeval tVar4;
  ulong local_f8;
  size_t i;
  size_t st;
  __suseconds_t local_e0;
  long local_d8;
  curl_off_t conn_id;
  curl_off_t xfer_id;
  char idsbuf [60];
  char timebuf [20];
  timeval tv;
  char *text;
  FILE *output;
  GlobalConfig *config;
  OperationConfig *operation;
  void *userdata_local;
  size_t size_local;
  char *data_local;
  curl_infotype type_local;
  CURL *handle_local;
  
  config_00 = *(GlobalConfig **)((long)userdata + 0x528);
  text = (char *)tool_stderr;
  if ((config_00->tracetime & 1U) == 0) {
    idsbuf[0x38] = '\0';
  }
  else {
    tVar4 = tvnow();
    st = tVar4.tv_sec;
    local_e0 = tVar4.tv_usec;
    pcVar2 = hms_for_sec(st);
    curl_msnprintf(idsbuf + 0x38,0x14,"%s.%06ld ",pcVar2,local_e0);
  }
  if ((((handle == (CURL *)0x0) || ((config_00->traceids & 1U) == 0)) ||
      (iVar1 = curl_easy_getinfo(handle,0x60003f,&conn_id), iVar1 != 0)) || (conn_id < 0)) {
    xfer_id._0_1_ = 0;
  }
  else {
    iVar1 = curl_easy_getinfo(handle,0x600040,&local_d8);
    if ((iVar1 == 0) && (-1 < local_d8)) {
      curl_msnprintf(&xfer_id,0x3c,"[%ld-%ld] ",conn_id,local_d8);
    }
    else {
      curl_msnprintf(&xfer_id,0x3c,"[%ld-x] ",conn_id);
    }
  }
  if (config_00->trace_stream == (FILE *)0x0) {
    iVar1 = strcmp("-",config_00->trace_dump);
    if (iVar1 == 0) {
      config_00->trace_stream = _stdout;
    }
    else {
      iVar1 = strcmp("%",config_00->trace_dump);
      if (iVar1 == 0) {
        config_00->trace_stream = tool_stderr;
      }
      else {
        pFVar3 = fopen64(config_00->trace_dump,"w");
        config_00->trace_stream = (FILE *)pFVar3;
        config_00->trace_fopened = true;
      }
    }
  }
  if (config_00->trace_stream != (FILE *)0x0) {
    text = (char *)config_00->trace_stream;
  }
  if (text == (char *)0x0) {
    warnf(config_00,"Failed to create/open output");
    return 0;
  }
  if (config_00->tracetype == TRACE_PLAIN) {
    if (type < CURLINFO_HEADER_OUT) {
      if ((tool_debug_cb::newl & 1U) == 0) {
        log_line_start((FILE *)text,idsbuf + 0x38,(char *)&xfer_id,type);
      }
      fwrite(data,size,1,(FILE *)text);
      tool_debug_cb::newl = false;
      if (size != 0) {
        tool_debug_cb::newl = data[size - 1] != '\n';
      }
      tool_debug_cb::traced_data = false;
      return 0;
    }
    if (type == CURLINFO_HEADER_OUT) {
      if (size != 0) {
        i = 0;
        for (local_f8 = 0; local_f8 < size - 1; local_f8 = local_f8 + 1) {
          if (data[local_f8] == '\n') {
            if ((tool_debug_cb::newl & 1U) == 0) {
              log_line_start((FILE *)text,idsbuf + 0x38,(char *)&xfer_id,CURLINFO_HEADER_OUT);
            }
            fwrite(data + i,(local_f8 - i) + 1,1,(FILE *)text);
            i = local_f8 + 1;
            tool_debug_cb::newl = false;
          }
        }
        if ((tool_debug_cb::newl & 1U) == 0) {
          log_line_start((FILE *)text,idsbuf + 0x38,(char *)&xfer_id,CURLINFO_HEADER_OUT);
        }
        fwrite(data + i,(local_f8 - i) + 1,1,(FILE *)text);
      }
      tool_debug_cb::newl = false;
      if (size != 0) {
        tool_debug_cb::newl = data[size - 1] != '\n';
      }
      tool_debug_cb::traced_data = false;
      return 0;
    }
    if (3 < type - CURLINFO_DATA_IN) {
      tool_debug_cb::newl = false;
      tool_debug_cb::traced_data = false;
      return 0;
    }
    if ((tool_debug_cb::traced_data & 1U) != 0) {
      return 0;
    }
    if ((config_00->isatty & 1U) != 0) {
      if ((FILE *)text == tool_stderr) {
        return 0;
      }
      if ((FILE *)text == _stdout) {
        return 0;
      }
    }
    if ((tool_debug_cb::newl & 1U) == 0) {
      log_line_start((FILE *)text,idsbuf + 0x38,(char *)&xfer_id,type);
    }
    curl_mfprintf(text,"[%zu bytes data]\n",size);
    tool_debug_cb::newl = false;
    tool_debug_cb::traced_data = true;
    return 0;
  }
  switch(type) {
  case CURLINFO_TEXT:
    curl_mfprintf(text,"%s%s== Info: %.*s",idsbuf + 0x38,&xfer_id,size & 0xffffffff,data);
    return 0;
  case CURLINFO_HEADER_IN:
    tv.tv_usec = (__suseconds_t)anon_var_dwarf_39a;
    break;
  case CURLINFO_HEADER_OUT:
    tv.tv_usec = (__suseconds_t)anon_var_dwarf_36e;
    break;
  case CURLINFO_DATA_IN:
    tv.tv_usec = (__suseconds_t)anon_var_dwarf_3a4;
    break;
  case CURLINFO_DATA_OUT:
    tv.tv_usec = (__suseconds_t)anon_var_dwarf_384;
    break;
  case CURLINFO_SSL_DATA_IN:
    tv.tv_usec = (__suseconds_t)anon_var_dwarf_3ae;
    break;
  case CURLINFO_SSL_DATA_OUT:
    tv.tv_usec = (__suseconds_t)anon_var_dwarf_3c4;
    break;
  default:
    goto switchD_0010b095_default;
  }
  dump(idsbuf + 0x38,(char *)&xfer_id,(char *)tv.tv_usec,(FILE *)text,(uchar *)data,size,
       config_00->tracetype,type);
switchD_0010b095_default:
  return 0;
}

Assistant:

int tool_debug_cb(CURL *handle, curl_infotype type,
                  char *data, size_t size,
                  void *userdata)
{
  struct OperationConfig *operation = userdata;
  struct GlobalConfig *config = operation->global;
  FILE *output = tool_stderr;
  const char *text;
  struct timeval tv;
  char timebuf[20];
  /* largest signed 64-bit is: 9,223,372,036,854,775,807
   * max length in decimal: 1 + (6*3) = 19
   * formatted via TRC_IDS_FORMAT_IDS_2 this becomes 2 + 19 + 1 + 19 + 2 = 43
   * negative xfer-id are not printed, negative conn-ids use TRC_IDS_FORMAT_1
   */
  char idsbuf[60];
  curl_off_t xfer_id, conn_id;

  (void)handle; /* not used */

  if(config->tracetime) {
    tv = tvnow();
    msnprintf(timebuf, sizeof(timebuf), "%s.%06ld ",
              hms_for_sec(tv.tv_sec), (long)tv.tv_usec);
  }
  else
    timebuf[0] = 0;

  if(handle && config->traceids &&
     !curl_easy_getinfo(handle, CURLINFO_XFER_ID, &xfer_id) && xfer_id >= 0) {
    if(!curl_easy_getinfo(handle, CURLINFO_CONN_ID, &conn_id) &&
        conn_id >= 0) {
      msnprintf(idsbuf, sizeof(idsbuf), TRC_IDS_FORMAT_IDS_2,
                xfer_id, conn_id);
    }
    else {
      msnprintf(idsbuf, sizeof(idsbuf), TRC_IDS_FORMAT_IDS_1, xfer_id);
    }
  }
  else
    idsbuf[0] = 0;

  if(!config->trace_stream) {
    /* open for append */
    if(!strcmp("-", config->trace_dump))
      config->trace_stream = stdout;
    else if(!strcmp("%", config->trace_dump))
      /* Ok, this is somewhat hackish but we do it undocumented for now */
      config->trace_stream = tool_stderr;
    else {
      config->trace_stream = fopen(config->trace_dump, FOPEN_WRITETEXT);
      config->trace_fopened = TRUE;
    }
  }

  if(config->trace_stream)
    output = config->trace_stream;

  if(!output) {
    warnf(config, "Failed to create/open output");
    return 0;
  }

  if(config->tracetype == TRACE_PLAIN) {
    static bool newl = FALSE;
    static bool traced_data = FALSE;

    switch(type) {
    case CURLINFO_HEADER_OUT:
      if(size > 0) {
        size_t st = 0;
        size_t i;
        for(i = 0; i < size - 1; i++) {
          if(data[i] == '\n') { /* LF */
            if(!newl) {
              log_line_start(output, timebuf, idsbuf, type);
            }
            (void)fwrite(data + st, i - st + 1, 1, output);
            st = i + 1;
            newl = FALSE;
          }
        }
        if(!newl)
          log_line_start(output, timebuf, idsbuf, type);
        (void)fwrite(data + st, i - st + 1, 1, output);
      }
      newl = (size && (data[size - 1] != '\n')) ? TRUE : FALSE;
      traced_data = FALSE;
      break;
    case CURLINFO_TEXT:
    case CURLINFO_HEADER_IN:
      if(!newl)
        log_line_start(output, timebuf, idsbuf, type);
      (void)fwrite(data, size, 1, output);
      newl = (size && (data[size - 1] != '\n')) ? TRUE : FALSE;
      traced_data = FALSE;
      break;
    case CURLINFO_DATA_OUT:
    case CURLINFO_DATA_IN:
    case CURLINFO_SSL_DATA_IN:
    case CURLINFO_SSL_DATA_OUT:
      if(!traced_data) {
        /* if the data is output to a tty and we are sending this debug trace
           to stderr or stdout, we do not display the alert about the data not
           being shown as the data _is_ shown then just not via this
           function */
        if(!config->isatty ||
           ((output != tool_stderr) && (output != stdout))) {
          if(!newl)
            log_line_start(output, timebuf, idsbuf, type);
          fprintf(output, "[%zu bytes data]\n", size);
          newl = FALSE;
          traced_data = TRUE;
        }
      }
      break;
    default: /* nada */
      newl = FALSE;
      traced_data = FALSE;
      break;
    }

    return 0;
  }

  switch(type) {
  case CURLINFO_TEXT:
    fprintf(output, "%s%s== Info: %.*s", timebuf, idsbuf, (int)size, data);
    FALLTHROUGH();
  default: /* in case a new one is introduced to shock us */
    return 0;

  case CURLINFO_HEADER_OUT:
    text = "=> Send header";
    break;
  case CURLINFO_DATA_OUT:
    text = "=> Send data";
    break;
  case CURLINFO_HEADER_IN:
    text = "<= Recv header";
    break;
  case CURLINFO_DATA_IN:
    text = "<= Recv data";
    break;
  case CURLINFO_SSL_DATA_IN:
    text = "<= Recv SSL data";
    break;
  case CURLINFO_SSL_DATA_OUT:
    text = "=> Send SSL data";
    break;
  }

  dump(timebuf, idsbuf, text, output, (unsigned char *) data, size,
       config->tracetype, type);
  return 0;
}